

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# file.hpp
# Opt level: O0

ssize_t __thiscall
hta::storage::file::File<hta::storage::file::Metric::Header,_hta::TimeAggregate>::read
          (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this,int __fd,void *__buf,
          size_t __nbytes)

{
  streamoff sVar1;
  undefined4 in_register_00000034;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_00;
  fpos<__mbstate_t> local_40;
  fpos<__mbstate_t> local_30;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *local_20;
  File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *this_local;
  pos_type pos_local;
  
  this_00 = (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)
            CONCAT44(in_register_00000034,__fd);
  local_20 = this_00;
  this_local = (File<hta::storage::file::Metric::Header,_hta::TimeAggregate> *)__buf;
  pos_local._M_off = __nbytes;
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&this_local);
  std::fpos<__mbstate_t>::fpos(&local_40,sVar1 * 0x38);
  sVar1 = std::fpos::operator_cast_to_long((fpos *)&local_40);
  local_30 = std::fpos<__mbstate_t>::operator+(&this_00->data_begin_,sVar1);
  std::istream::seekg(&this_00->stream_,local_30._M_off,local_30._M_state);
  check_stream(this_00,"seekg for read");
  read<hta::TimeAggregate>((TimeAggregate *)this,this_00);
  return (ssize_t)this;
}

Assistant:

value_type read(pos_type pos)
    {
        stream_.seekg(data_begin_ + static_cast<pos_type>(pos * value_size));
        check_stream("seekg for read");
        return read<value_type>();
    }